

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O2

int lj_carith_op(lua_State *L,MMS mm)

{
  ushort uVar1;
  CTState *cts;
  bool bVar2;
  uint8_t *puVar3;
  CTypeID CVar4;
  uint uVar5;
  uint uVar6;
  CTSize CVar7;
  int iVar8;
  ulong uVar9;
  CType *pCVar10;
  cTValue *tv;
  TValue *pTVar11;
  void *pvVar12;
  GCstr *pGVar13;
  CType *pCVar14;
  ulong uVar15;
  uint64_t uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ErrMsg em;
  undefined4 in_register_00000034;
  uint uVar20;
  uint *puVar21;
  uint8_t *puVar22;
  uint64_t uVar23;
  ulong uVar24;
  bool bVar25;
  ulong local_70;
  uint64_t u0;
  uint64_t local_60;
  undefined8 local_58;
  CDArith ca;
  
  local_58 = CONCAT44(in_register_00000034,mm);
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  pTVar11 = L->base;
  if (L->top <= pTVar11 + 1) {
    lj_err_argt(L,1,10);
  }
  bVar25 = true;
  for (lVar18 = 0; puVar22 = ca.p[1], puVar3 = ca.p[0], lVar18 != 2; lVar18 = lVar18 + 1) {
    uVar19 = pTVar11->u64;
    uVar9 = (long)uVar19 >> 0x2f;
    if (uVar9 == 0xfffffffffffffff5) {
      uVar1 = *(ushort *)((uVar19 & 0x7fffffffffff) + 10);
      pCVar14 = cts->tab;
      uVar6 = pCVar14[uVar1].info;
      uVar20 = uVar6 & 0xf0000000;
      puVar21 = (uint *)((uVar19 & 0x7fffffffffff) + 0x10);
      if (uVar6 >> 0x1c == 6) {
        puVar21 = *(uint **)puVar21;
        CVar4 = lj_ctype_intern(cts,uVar1 | 0x20030000,8);
        pCVar14 = cts->tab;
        pCVar10 = pCVar14 + CVar4;
        uVar6 = pCVar14[CVar4].info;
        uVar20 = uVar6 & 0xf0000000;
      }
      else {
        pCVar10 = pCVar14 + uVar1;
        if (uVar6 >> 0x1c == 2) {
          if (pCVar10->size == 4) {
            puVar21 = (uint *)(ulong)*puVar21;
          }
          else {
            puVar21 = *(uint **)puVar21;
          }
          if ((uVar6 & 0xf0800000) == 0x20800000) {
            uVar5 = uVar6 & 0xffff;
            uVar6 = pCVar14[uVar5].info;
            uVar20 = uVar6 & 0xf0000000;
            pCVar10 = pCVar14 + uVar5;
          }
        }
      }
      pCVar14 = pCVar14 + (uVar6 & 0xffff);
      if (uVar20 != 0x50000000) {
        pCVar14 = pCVar10;
      }
      ca.ct[lVar18] = pCVar14;
      ca.p[lVar18] = (uint8_t *)puVar21;
    }
    else if (uVar9 < 0xfffffffffffffff2) {
      ca.ct[lVar18] = cts->tab + 0xe;
      ca.p[lVar18] = (uint8_t *)pTVar11;
    }
    else if (uVar19 == 0xffffffffffffffff) {
      ca.ct[lVar18] = cts->tab + 0x11;
      ca.p[lVar18] = (uint8_t *)0x0;
    }
    else if (uVar9 == 0xfffffffffffffffb) {
      uVar1 = *(ushort *)((pTVar11[(ulong)(lVar18 == 0) * 2 + -1].u64 & 0x7fffffffffff) + 10);
      pCVar14 = cts->tab;
      uVar6 = pCVar14[uVar1].info;
      ca.ct[lVar18] = (CType *)0x0;
      ca.p[lVar18] = (uint8_t *)((GCstr *)(uVar19 & 0x7fffffffffff) + 1);
      bVar25 = false;
      if ((uVar6 & 0xf0000000) == 0x50000000) {
        pCVar14 = pCVar14 + uVar1;
        pCVar10 = lj_ctype_getfieldq(cts,pCVar14,(GCstr *)(uVar19 & 0x7fffffffffff),(CTSize *)&u0,
                                     (CTInfo *)0x0);
        if ((pCVar10 == (CType *)0x0) || ((pCVar10->info & 0xf0000000) != 0xb0000000)) {
          uVar6 = 1 - (int)lVar18;
          ca.ct[uVar6] = pCVar14;
          ca.p[uVar6] = (uint8_t *)0x0;
          goto LAB_00141e6f;
        }
        ca.ct[lVar18] = cts->tab + (pCVar10->info & 0xffff);
        ca.p[lVar18] = (uint8_t *)&pCVar10->size;
        bVar25 = true;
      }
    }
    else {
      ca.ct[lVar18] = (CType *)0x0;
      ca.p[lVar18] = (uint8_t *)0x1;
      bVar25 = false;
    }
    pTVar11 = pTVar11 + 1;
  }
  if (((!bVar25) || (uVar6 = (uint)local_58, uVar6 == 5)) || (uVar6 == 8)) goto LAB_00141e6f;
  uVar20 = ca.ct[0]->info;
  if (((0xfffffff < uVar20) || (8 < ca.ct[0]->size)) ||
     ((0xfffffff < ca.ct[1]->info || (8 < ca.ct[1]->size)))) {
    if ((uVar20 & 0xf0000000) == 0x20000000 || (uVar20 & 0xfc000000) == 0x30000000) {
      if (((uVar6 < 0xc) && ((0x8d0U >> (uVar6 & 0x1f) & 1) != 0)) &&
         ((ca.ct[1]->info & 0xf0000000) == 0x20000000 || (ca.ct[1]->info & 0xfc000000) == 0x30000000
         )) {
        if (uVar6 == 4) {
          bVar25 = ca.p[0] != ca.p[1];
          goto LAB_00141cc6;
        }
        iVar8 = lj_cconv_compatptr(cts,ca.ct[0],ca.ct[1],8);
        if (iVar8 != 0) {
          if (uVar6 != 0xb) {
            uVar23 = 0xffff7fffffffffff;
            uVar16 = 0xfffeffffffffffff;
            pTVar11 = L->top;
            if (uVar6 != 6) {
              if (puVar22 < puVar3) {
                uVar16 = 0xffff7fffffffffff;
              }
              pTVar11[-1].u64 = uVar16;
              goto LAB_00142254;
            }
            if (puVar3 < puVar22) {
              uVar23 = 0xfffeffffffffffff;
            }
            goto LAB_001420b8;
          }
          CVar7 = lj_ctype_size(cts,(uint)(ushort)ca.ct[0]->info);
          if (1 < CVar7 + 1) {
            L->top[-1].n = (double)(int)(((long)puVar3 - (long)puVar22) / (long)(int)CVar7);
            goto LAB_00142254;
          }
        }
      }
      else if (((uVar6 & 0xfffffffe) == 10) && (ca.ct[1]->info < 0x10000000)) {
        lj_cconv_ct_ct(cts,cts->tab + 0xb,ca.ct[1],(uint8_t *)&u0,ca.p[1],0);
        pCVar14 = ca.ct[0];
        puVar22 = puVar3;
        if (uVar6 == 0xb) {
          u0 = -u0;
        }
        goto LAB_00141dad;
      }
    }
    else if ((uVar6 == 10 && uVar20 < 0x10000000) &&
            ((ca.ct[1]->info & 0xf0000000) == 0x20000000 ||
             (ca.ct[1]->info & 0xfc000000) == 0x30000000)) {
      lj_cconv_ct_ct(cts,cts->tab + 0xb,ca.ct[0],(uint8_t *)&u0,ca.p[0],0);
      pCVar14 = ca.ct[1];
LAB_00141dad:
      CVar7 = lj_ctype_size(cts,(uint)(ushort)pCVar14->info);
      if (CVar7 != 0xffffffff) {
        lVar18 = (long)(int)CVar7 * u0;
        CVar4 = lj_ctype_intern(cts,(ushort)pCVar14->info | 0x20030000,8);
        pvVar12 = lj_mem_newgco(cts->L,0x18);
        *(undefined1 *)((long)pvVar12 + 9) = 10;
        *(short *)((long)pvVar12 + 10) = (short)CVar4;
        *(uint8_t **)((long)pvVar12 + 0x10) = puVar22 + lVar18;
        L->top[-1].u64 = (ulong)pvVar12 | 0xfffa800000000000;
        goto switchD_0014204a_default;
      }
    }
LAB_00141e6f:
    uVar23 = 0xffff7fffffffffff;
    pTVar11 = L->base;
    if ((pTVar11->u64 & 0xffff800000000000) == 0xfffa800000000000) {
      uVar1 = *(ushort *)((pTVar11->u64 & 0x7fffffffffff) + 10);
      uVar6 = cts->tab[uVar1].info;
      uVar20 = (uint)uVar1;
      if ((uVar6 & 0xf0000000) == 0x20000000) {
        uVar20 = uVar6 & 0xffff;
      }
      tv = lj_ctype_meta(cts,uVar20,(MMS)local_58);
      if (tv != (cTValue *)0x0) goto LAB_00141f3b;
      pTVar11 = L->base;
    }
    if ((pTVar11 + 1 < L->top) &&
       (uVar19 = pTVar11[1].u64, (uVar19 & 0xffff800000000000) == 0xfffa800000000000)) {
      uVar1 = *(ushort *)((uVar19 & 0x7fffffffffff) + 10);
      uVar6 = cts->tab[uVar1].info;
      uVar20 = (uint)uVar1;
      if ((uVar6 & 0xf0000000) == 0x20000000) {
        uVar20 = uVar6 & 0xffff;
      }
      tv = lj_ctype_meta(cts,uVar20,(MMS)local_58);
      if (tv != (cTValue *)0x0) {
LAB_00141f3b:
        iVar8 = lj_meta_tailcall(L,tv);
        return iVar8;
      }
    }
    if ((uint)local_58 == 4) {
      if (ca.p[0] == ca.p[1]) {
        uVar23 = 0xfffeffffffffffff;
      }
      L->top[-1].u64 = uVar23;
      *(uint64_t *)((L->glref).ptr64 + 0xf0) = uVar23;
      return 1;
    }
    uVar19 = 0xffffffffffffffff;
    uVar9 = 0xffffffff;
    for (uVar24 = 0; uVar24 != 2; uVar24 = uVar24 + 1) {
      pCVar14 = ca.ct[uVar24];
      uVar17 = L->base[uVar24].it64 & 0xffff800000000000;
      if ((pCVar14 == (CType *)0x0) || (uVar17 != 0xfffa800000000000)) {
        if (uVar17 == 0xfffd800000000000) {
          uVar9 = uVar24 & 0xffffffff;
        }
        uVar15 = L->base[uVar24].it64 >> 0x2f;
        uVar17 = ~uVar15;
        if (uVar15 < 0xfffffffffffffff3) {
          uVar17 = 0xd;
        }
        pGVar13 = (GCstr *)lj_obj_itypename[uVar17];
      }
      else {
        if ((pCVar14->info & 0xf0000000) == 0x50000000) {
          uVar19 = uVar24;
        }
        uVar19 = uVar19 & 0xffffffff;
        pGVar13 = lj_ctype_repr(L,(CTypeID)(((long)pCVar14 - (long)cts->tab) / 0x18),(GCstr *)0x0);
        pGVar13 = pGVar13 + 1;
      }
      (&u0)[uVar24] = (uint64_t)pGVar13;
    }
    if (((uint)uVar9 ^ (uint)uVar19) == 1) {
      local_60 = (&u0)[(int)(uint)uVar19];
      uVar23 = (&u0)[(int)(uint)uVar9];
      em = LJ_ERR_FFI_BADCONV;
    }
    else {
      uVar23 = u0;
      if ((uint)local_58 == 5) {
        em = LJ_ERR_FFI_BADLEN;
      }
      else if ((uint)local_58 == 8) {
        em = LJ_ERR_FFI_BADCONCAT;
      }
      else {
        em = LJ_ERR_FFI_BADARITH;
        if ((uint)local_58 < 10) {
          em = LJ_ERR_FFI_BADCOMP;
        }
      }
    }
    lj_err_callerv(L,em,uVar23,local_60);
  }
  if (((byte)(uVar20 >> 0x17) & ca.ct[0]->size == 8) == 0) {
    if ((ca.ct[1]->info >> 0x17 & 1) == 0) {
      uVar20 = 0xb;
    }
    else {
      uVar20 = (ca.ct[1]->size == 8) + 0xb;
    }
  }
  else {
    uVar20 = 0xc;
  }
  pCVar14 = cts->tab;
  lj_cconv_ct_ct(cts,pCVar14 + uVar20,ca.ct[0],(uint8_t *)&u0,ca.p[0],0);
  if (uVar6 != 0x10) {
    lj_cconv_ct_ct(cts,pCVar14 + uVar20,ca.ct[1],(uint8_t *)&local_70,ca.p[1],0);
    if (uVar6 == 7) {
      bVar25 = u0 <= local_70;
      bVar2 = (long)u0 <= (long)local_70;
    }
    else {
      if (uVar6 != 6) {
        if (uVar6 == 4) {
          uVar23 = ((ulong)(u0 != local_70) << 0x2f) + 0xfffeffffffffffff;
          pTVar11 = L->top;
LAB_001420b8:
          pTVar11[-1].u64 = uVar23;
          goto LAB_00142254;
        }
        goto LAB_00141ffe;
      }
      bVar25 = u0 < local_70;
      bVar2 = (long)u0 < (long)local_70;
    }
    if (uVar20 == 0xb) {
      bVar25 = bVar2;
    }
    bVar25 = (bool)(bVar25 ^ 1);
LAB_00141cc6:
    L->top[-1].u64 = ((ulong)bVar25 << 0x2f) + 0xfffeffffffffffff;
    goto LAB_00142254;
  }
LAB_00141ffe:
  pvVar12 = lj_mem_newgco(cts->L,0x18);
  *(undefined1 *)((long)pvVar12 + 9) = 10;
  *(short *)((long)pvVar12 + 10) = (short)uVar20;
  L->top[-1].u64 = (ulong)pvVar12 | 0xfffa800000000000;
  switch(uVar6) {
  case 10:
    uVar19 = local_70 + u0;
    break;
  case 0xb:
    uVar19 = u0 - local_70;
    break;
  case 0xc:
    uVar19 = local_70 * u0;
    break;
  case 0xd:
    uVar19 = 0x8000000000000000;
    if (uVar20 == 0xb) {
      if ((local_70 != 0) && (local_70 != 0xffffffffffffffff || u0 != 0x8000000000000000)) {
        uVar19 = (long)u0 / (long)local_70;
      }
    }
    else if (local_70 != 0) {
      uVar19 = u0 / local_70;
    }
    break;
  case 0xe:
    if (uVar20 == 0xb) {
      uVar19 = 0x8000000000000000;
      if (local_70 != 0) {
        if (local_70 == 0xffffffffffffffff && u0 == 0x8000000000000000) {
          uVar19 = 0;
        }
        else {
          uVar19 = (long)u0 % (long)local_70;
        }
      }
    }
    else if (local_70 == 0) {
      uVar19 = 0x8000000000000000;
    }
    else {
      uVar19 = u0 % local_70;
    }
    break;
  case 0xf:
    if (uVar20 == 0xb) {
      uVar19 = lj_carith_powi64(u0,local_70);
    }
    else {
      uVar19 = lj_carith_powu64(u0,local_70);
    }
    break;
  case 0x10:
    uVar19 = -u0;
    break;
  default:
    goto switchD_0014204a_default;
  }
  *(ulong *)((long)pvVar12 + 0x10) = uVar19;
switchD_0014204a_default:
  uVar23 = (L->glref).ptr64;
  if (*(ulong *)(uVar23 + 0x18) <= *(ulong *)(uVar23 + 0x10)) {
    lj_gc_step(L);
  }
LAB_00142254:
  *(TValue *)((L->glref).ptr64 + 0xf0) = L->top[-1];
  return 1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}